

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_compound_stmt(gvisitor_t *self,gnode_compound_stmt_t *node)

{
  symboltable_t *table;
  gnode_t *local_78;
  gnode_t *local_70;
  gnode_t *local_68;
  long local_60;
  long local_50;
  gnode_t *val;
  size_t _i;
  size_t _len;
  symboltable_t *symtable;
  gnode_t *top;
  gnode_compound_stmt_t *node_local;
  gvisitor_t *self_local;
  
  if (*self->data == 0) {
    local_50 = 0;
  }
  else {
    local_50 = **self->data;
  }
  if (local_50 - 1U < **self->data) {
    if (*self->data == 0) {
      local_60 = 0;
    }
    else {
      local_60 = **self->data;
    }
    local_68 = *(gnode_t **)(*(long *)(*self->data + 0x10) + (local_60 + -1) * 8);
  }
  else {
    local_68 = (gnode_t *)0x0;
  }
  table = symtable_from_node(local_68);
  if (table != (symboltable_t *)0x0) {
    symboltable_enter_scope(table);
    if (node->stmts == (gnode_r *)0x0) {
      local_70 = (gnode_t *)0x0;
    }
    else {
      local_70 = (gnode_t *)node->stmts->n;
    }
    for (val = (gnode_t *)0x0; val < local_70; val = (gnode_t *)((long)&val->tag + 1)) {
      if (val < (gnode_t *)node->stmts->n) {
        local_78 = node->stmts->p[(long)val];
      }
      else {
        local_78 = (gnode_t *)0x0;
      }
      gvisit(self,local_78);
    }
    symboltable_exit_scope(table,&node->nclose);
  }
  return;
}

Assistant:

static void visit_compound_stmt (gvisitor_t *self, gnode_compound_stmt_t *node) {
    DEBUG_CODEGEN("visit_compound_stmt");

    gnode_array_each(node->stmts, {
        visit(val);

        // check if context is a function
        DECLARE_CONTEXT();
        bool is_func_ctx = OBJECT_ISA_FUNCTION(context_object);
        if (!is_func_ctx) continue;

        // in case of function context cleanup temporary registers
        gravity_function_t *f = (gravity_function_t*)context_object;
        ircode_t *code = (ircode_t *)f->bytecode;
        ircode_register_temps_clear(code);
    });

    if (node->nclose != UINT32_MAX) {
        DECLARE_CODE();
		ircode_add(code, CLOSE, node->nclose, 0, 0, LINE_NUMBER(node));
    }
}